

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O1

void __thiscall Kernel::Kernel(Kernel *this,int width,int height)

{
  pointer pfVar1;
  runtime_error *this_00;
  allocator_type local_49;
  vector<float,_std::allocator<float>_> local_48;
  value_type_conflict2 local_24;
  
  this->width = width;
  this->height = height;
  this->xoff = 0;
  this->yoff = 0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->scale = 1.0;
  if (((((width & 0x80000001U) == 1) && (0 < height)) && (0 < width)) &&
     ((height & 0x80000001U) == 1)) {
    local_24 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_48,(ulong)(uint)(height * width),&local_24,&local_49);
    pfVar1 = (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1);
    }
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    this->yoff = (uint)height >> 1;
    this->xoff = (uint)width >> 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Each kernel dimension must be positive uneven.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Kernel::Kernel(int width, int height) : width(width), height(height) {
  if ((width % 2 != 1) || (height % 2 != 1) || (width < 1) || (height < 1)) {
    throw std::runtime_error("Each kernel dimension must be positive uneven.");
  }
  weights = std::vector<float>((size_t) (width * height), 0.0f);
  yoff = height / 2;
  xoff = width / 2;
}